

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_partial_sig_load
              (secp256k1_context *ctx,secp256k1_scalar *s,secp256k1_musig_partial_sig *sig)

{
  int iVar1;
  secp256k1_callback *in_RDX;
  uchar *in_RSI;
  secp256k1_scalar *in_RDI;
  int overflow;
  char *in_stack_ffffffffffffffd8;
  uint local_4;
  
  iVar1 = secp256k1_memcmp_var(in_RDX,secp256k1_musig_partial_sig_magic,4);
  if (iVar1 == 0) {
    secp256k1_scalar_set_b32(in_RDI,in_RSI,(int *)in_RDX);
  }
  else {
    secp256k1_callback_call(in_RDX,in_stack_ffffffffffffffd8);
  }
  local_4 = (uint)(iVar1 == 0);
  return local_4;
}

Assistant:

static int secp256k1_musig_partial_sig_load(const secp256k1_context* ctx, secp256k1_scalar *s, const secp256k1_musig_partial_sig* sig) {
    int overflow;

    ARG_CHECK(secp256k1_memcmp_var(&sig->data[0], secp256k1_musig_partial_sig_magic, 4) == 0);
    secp256k1_scalar_set_b32(s, &sig->data[4], &overflow);
    /* Parsed signatures can not overflow */
    VERIFY_CHECK(!overflow);
    return 1;
}